

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void next_CE(read_ce_queue *heap)

{
  read_ce_req *prVar1;
  read_ce_req *prVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  file_info *pfVar6;
  int iVar7;
  read_ce_req tmp;
  int c;
  int b;
  int a;
  uint64_t c_offset;
  uint64_t b_offset;
  uint64_t a_offset;
  read_ce_queue *heap_local;
  
  if (0 < heap->cnt) {
    prVar1 = heap->reqs;
    prVar2 = heap->reqs;
    iVar7 = heap->cnt + -1;
    heap->cnt = iVar7;
    prVar1->offset = prVar2[iVar7].offset;
    prVar1->file = prVar2[iVar7].file;
    a = 0;
    uVar3 = heap->reqs->offset;
    while( true ) {
      b = a * 2 + 1;
      if (heap->cnt <= b) break;
      b_offset = heap->reqs[b].offset;
      iVar7 = a * 2 + 2;
      if ((iVar7 < heap->cnt) && (uVar4 = heap->reqs[iVar7].offset, uVar4 < b_offset)) {
        b = iVar7;
        b_offset = uVar4;
      }
      if (uVar3 <= b_offset) {
        return;
      }
      uVar5 = heap->reqs[a].offset;
      pfVar6 = heap->reqs[a].file;
      prVar1 = heap->reqs;
      prVar2 = heap->reqs;
      prVar1[a].offset = prVar2[b].offset;
      prVar1[a].file = prVar2[b].file;
      prVar1 = heap->reqs;
      prVar1[b].offset = uVar5;
      prVar1[b].file = pfVar6;
      a = b;
    }
  }
  return;
}

Assistant:

static void
next_CE(struct read_ce_queue *heap)
{
	uint64_t a_offset, b_offset, c_offset;
	int a, b, c;
	struct read_ce_req tmp;

	if (heap->cnt < 1)
		return;

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->reqs[0] = heap->reqs[--(heap->cnt)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its offset */
	a_offset = heap->reqs[a].offset;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->cnt)
			return;
		b_offset = heap->reqs[b].offset;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->cnt) {
			c_offset = heap->reqs[c].offset;
			if (c_offset < b_offset) {
				b = c;
				b_offset = c_offset;
			}
		}
		if (a_offset <= b_offset)
			return;
		tmp = heap->reqs[a];
		heap->reqs[a] = heap->reqs[b];
		heap->reqs[b] = tmp;
		a = b;
	}
}